

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O0

void __thiscall
duckdb::BuiltinFunctions::AddExtensionFunction(BuiltinFunctions *this,ScalarFunctionSet *set)

{
  long in_RDI;
  CreateScalarFunctionInfo info;
  ScalarFunctionSet *in_stack_fffffffffffffd78;
  ScalarFunctionSet *in_stack_fffffffffffffd80;
  CreateScalarFunctionInfo *this_00;
  ScalarFunctionSet *in_stack_fffffffffffffde8;
  CreateScalarFunctionInfo *in_stack_fffffffffffffdf0;
  CreateFunctionInfo *in_stack_fffffffffffffe00;
  Catalog *in_stack_fffffffffffffe08;
  CatalogTransaction in_stack_fffffffffffffe20;
  
  ScalarFunctionSet::ScalarFunctionSet(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  CreateScalarFunctionInfo::CreateScalarFunctionInfo
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  ScalarFunctionSet::~ScalarFunctionSet((ScalarFunctionSet *)0x2684d7);
  this_00 = *(CreateScalarFunctionInfo **)(in_RDI + 8);
  Catalog::CreateFunction
            (in_stack_fffffffffffffe08,in_stack_fffffffffffffe20,in_stack_fffffffffffffe00);
  CreateScalarFunctionInfo::~CreateScalarFunctionInfo(this_00);
  return;
}

Assistant:

void BuiltinFunctions::AddExtensionFunction(ScalarFunctionSet set) {
	CreateScalarFunctionInfo info(std::move(set));
	info.internal = true;
	catalog.CreateFunction(transaction, info);
}